

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::reset(QWizardPrivate *this)

{
  QWizard *this_00;
  int *piVar1;
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar2;
  QWidget *this_01;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  
  if (this->current != -1) {
    this_00 = *(QWizard **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    this_01 = &QWizard::currentPage(this_00)->super_QWidget;
    QWidget::hide(this_01);
    cleanupPagesNotInHistory(this);
    piVar1 = (this->history).d.ptr;
    for (lVar4 = (this->history).d.size << 2; lVar4 != 0; lVar4 = lVar4 + -4) {
      (**(code **)(*(long *)&(this_00->super_QDialog).super_QWidget + 0x1e0))
                (this_00,*(undefined4 *)((long)piVar1 + lVar4 + -4));
    }
    QList<int>::clear(&this->history);
    pQVar2 = (this->pageMap).d.d.ptr;
    if (pQVar2 == (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                   *)0x0) {
      p_Var3 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var3 = *(_Base_ptr *)
                ((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var5 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar2 == (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                   *)0x0) {
      p_Var5 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var3 != p_Var5; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      *(undefined1 *)((long)&(p_Var3[1]._M_parent)->_M_parent[0x18]._M_parent + 6) = 0;
    }
    this->current = -1;
    QWizard::currentIdChanged(this_00,-1);
    return;
  }
  return;
}

Assistant:

void QWizardPrivate::reset()
{
    Q_Q(QWizard);
    if (current != -1) {
        q->currentPage()->hide();
        cleanupPagesNotInHistory();
        const auto end = history.crend();
        for (auto it = history.crbegin(); it != end; ++it)
            q->cleanupPage(*it);
        history.clear();
        for (QWizardPage *page : std::as_const(pageMap))
            page->d_func()->initialized = false;

        current = -1;
        emit q->currentIdChanged(-1);
    }
}